

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# markdownhighlighter.cpp
# Opt level: O3

void __thiscall MarkdownHighlighter::iniHighlighter(MarkdownHighlighter *this,QString *text)

{
  char16_t cVar1;
  long lVar2;
  char cVar3;
  int iVar4;
  QTextFormat *pQVar5;
  CaseSensitivity CVar6;
  int iVar7;
  QChar QVar8;
  wchar32 wVar11;
  int iVar12;
  long lVar13;
  QTextCharFormat format;
  anon_union_24_3_e3d07ef4_for_data local_70;
  QTextFormat local_50 [16];
  QColor local_40;
  UnderlineStyle UVar9;
  int iVar10;
  
  lVar2 = (text->d).size;
  if (0 < lVar2) {
    lVar13 = 0;
    iVar7 = 0;
    do {
      cVar1 = (text->d).ptr[lVar13];
      iVar12 = (int)lVar2;
      CVar6 = (CaseSensitivity)lVar13;
      QVar8.ucs = (char16_t)text;
      UVar9 = (UnderlineStyle)local_50;
      iVar10 = (int)this;
      if (cVar1 == L'[') {
        local_70._0_4_ = 0x3eb;
        pQVar5 = &QHash<MarkdownHighlighter::HighlighterState,_QTextCharFormat>::operator[]
                            (&_formats,(HighlighterState *)local_70.data)->super_QTextFormat;
        QTextFormat::QTextFormat(local_50,pQVar5);
        iVar4 = QString::indexOf(QVar8,0x5d,CVar6);
        if (iVar4 == -1) {
          QTextCharFormat::setUnderlineStyle(UVar9);
          QColor::QColor(&local_40,red);
          QColor::operator_cast_to_QVariant((QVariant *)&local_70,&local_40);
          QTextFormat::setProperty(UVar9,(QVariant *)0x2020);
          QVariant::~QVariant((QVariant *)&local_70);
          iVar4 = iVar12;
        }
        iVar4 = iVar4 + 1;
        QSyntaxHighlighter::setFormat(iVar10,iVar7,(QTextCharFormat *)(ulong)(uint)(iVar4 - iVar7));
LAB_00124989:
        QTextFormat::~QTextFormat(local_50);
        iVar7 = iVar4;
        if (lVar2 <= iVar4) {
          return;
        }
      }
      else {
        if (cVar1 == L';') {
          local_70._0_4_ = 0x3ea;
          QHash<MarkdownHighlighter::HighlighterState,_QTextCharFormat>::operator[]
                    (&_formats,(HighlighterState *)local_70.data);
          QSyntaxHighlighter::setFormat
                    (iVar10,iVar7,(QTextCharFormat *)(ulong)(uint)(iVar12 - iVar7));
          return;
        }
        if ((ushort)cVar1 - 0x41 < 0x3a && (ushort)cVar1 - 0x61 < 0xfffffffa) {
LAB_00124842:
          local_70._0_4_ = 1000;
          pQVar5 = &QHash<MarkdownHighlighter::HighlighterState,_QTextCharFormat>::operator[]
                              (&_formats,(HighlighterState *)local_70.data)->super_QTextFormat;
          QTextFormat::QTextFormat(local_50,pQVar5);
          iVar4 = QString::indexOf(QVar8,0x3d,CVar6);
          if (iVar4 == -1) {
            QColor::QColor(&local_40,red);
            QColor::operator_cast_to_QVariant((QVariant *)&local_70,&local_40);
            QTextFormat::setProperty(UVar9,(QVariant *)0x2020);
            QVariant::~QVariant((QVariant *)&local_70);
            QTextCharFormat::setUnderlineStyle(UVar9);
            iVar4 = iVar12;
          }
          QSyntaxHighlighter::setFormat
                    (iVar10,iVar7,(QTextCharFormat *)(ulong)(uint)(iVar4 - iVar7));
          iVar4 = iVar4 + -1;
          goto LAB_00124989;
        }
        wVar11 = (wchar32)(ushort)cVar1;
        if ((uint)wVar11 < 0x80) {
          if (wVar11 == L'=') {
            iVar7 = QString::indexOf(QVar8,0x3b,CVar6);
            if (iVar7 == -1) {
              return;
            }
            iVar7 = iVar7 + -1;
          }
        }
        else {
          cVar3 = QChar::isLetter_helper(wVar11);
          if (cVar3 != '\0') goto LAB_00124842;
        }
      }
      iVar7 = iVar7 + 1;
      lVar13 = (long)iVar7;
    } while (lVar13 < lVar2);
  }
  return;
}

Assistant:

void MarkdownHighlighter::iniHighlighter(const QString &text) {
    if (text.isEmpty()) return;
    const auto textLen = text.length();

    for (int i = 0; i < textLen; ++i) {
        // start of a [section]
        if (text.at(i) == QChar('[')) {
            QTextCharFormat sectionFormat = _formats[CodeType];
            int sectionEnd = text.indexOf(QChar(']'), i);
            // if an end bracket isn't found, we apply red underline to show
            // error
            if (sectionEnd == -1) {
                sectionFormat.setUnderlineStyle(QTextCharFormat::DotLine);
                sectionFormat.setUnderlineColor(Qt::red);
                sectionEnd = textLen;
            }
            sectionEnd++;
            setFormat(i, sectionEnd - i, sectionFormat);
            i = sectionEnd;
            if (i >= textLen) break;
        }

        // comment ';'
        else if (text.at(i) == QChar(';')) {
            setFormat(i, textLen - i, _formats[CodeComment]);
            i = textLen;
            break;
        }

        // key-val
        else if (text.at(i).isLetter()) {
            QTextCharFormat format = _formats[CodeKeyWord];
            int equalsPos = text.indexOf(QChar('='), i);
            if (equalsPos == -1) {
                format.setUnderlineColor(Qt::red);
                format.setUnderlineStyle(QTextCharFormat::DotLine);
                equalsPos = textLen;
            }
            setFormat(i, equalsPos - i, format);
            i = equalsPos - 1;
            if (i >= textLen) break;
        }
        // skip everything after '=' (except comment)
        else if (text.at(i) == QChar('=')) {
            const int findComment = text.indexOf(QChar(';'), i);
            if (findComment == -1) break;
            i = findComment - 1;
        }
    }
}